

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcode.h
# Opt level: O0

void __thiscall
barcode_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::betti_number
          (barcode_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *this,
          size_t _betti,size_t _skipped)

{
  uint uVar1;
  reference pvVar2;
  int iVar3;
  size_type in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  long in_RDI;
  int shifted_dimension;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar5;
  
  uVar1 = (uint)*(ushort *)(in_RDI + 0x210) - (uint)*(ushort *)(in_RDI + 0x212);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (in_RSI,in_RDX,(value_type_conflict3 *)CONCAT44(uVar1,in_stack_ffffffffffffffe0));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (in_RSI,in_RDX,(value_type_conflict3 *)CONCAT44(uVar1,in_stack_ffffffffffffffe0));
  pvVar5 = in_RSI;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x218),
                      (long)(int)uVar1);
  iVar4 = (int)pvVar5;
  *pvVar2 = (value_type)in_RSI;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x230),
                      (long)(int)uVar1);
  *pvVar2 = in_RDX;
  iVar3 = 1;
  if ((uVar1 & 1) != 0) {
    iVar3 = -1;
  }
  *(int *)(in_RDI + 0x248) = iVar3 * iVar4 + *(int *)(in_RDI + 0x248);
  return;
}

Assistant:

void betti_number(size_t _betti, size_t _skipped) {
		const auto shifted_dimension = current_dimension - min_dimension;
		betti.resize(shifted_dimension + 1, 0);
		skipped.resize(shifted_dimension + 1, 0);
		betti[shifted_dimension] = _betti;
		skipped[shifted_dimension] = _skipped;
		euler_characteristic += (shifted_dimension & 1 ? -1 : 1) * index_t(_betti);
	}